

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,
                          opj_event_mgr_t *p_manager)

{
  uint uVar1;
  ulong uVar2;
  OPJ_UINT32 OVar3;
  OPJ_BOOL OVar4;
  OPJ_BYTE *p_buffer;
  OPJ_SIZE_T OVar5;
  char *fmt;
  opj_tcp_t *poVar6;
  opj_event_mgr *in_R9;
  OPJ_UINT32 local_4c;
  opj_event_mgr_t *local_48;
  ulong local_40;
  opj_stream_private_t *local_38;
  
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xa1d,
                  "OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xa1e,
                  "OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  local_38 = p_stream;
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xa1f,
                  "OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  poVar6 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  OVar3 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_j2k->m_current_tile_number,0);
  uVar1 = OVar3 + 9;
  local_40 = (ulong)uVar1;
  p_buffer = (p_j2k->m_specific_param).m_encoder.m_header_tile_data;
  if ((p_j2k->m_specific_param).m_encoder.m_header_tile_data_size < uVar1) {
    p_buffer = (OPJ_BYTE *)opj_realloc(p_buffer,local_40);
    if (p_buffer == (OPJ_BYTE *)0x0) {
      opj_free((p_j2k->m_specific_param).m_encoder.m_header_tile_data);
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data = (OPJ_BYTE *)0x0;
      (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = 0;
      fmt = "Not enough memory to write COD marker\n";
      goto LAB_0011fbe4;
    }
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data = p_buffer;
    (p_j2k->m_specific_param).m_encoder.m_header_tile_data_size = uVar1;
  }
  local_48 = p_manager;
  opj_write_bytes_LE(p_buffer,0xff52,2);
  opj_write_bytes_LE(p_buffer + 2,OVar3 + 7,2);
  opj_write_bytes_LE(p_buffer + 4,poVar6->csty,1);
  opj_write_bytes_LE(p_buffer + 5,poVar6->prg,1);
  opj_write_bytes_LE(p_buffer + 6,poVar6->numlayers,2);
  opj_write_bytes_LE(p_buffer + 8,poVar6->mct,1);
  p_manager = local_48;
  local_4c = OVar3;
  OVar4 = opj_j2k_write_SPCod_SPCoc
                    (p_j2k,p_j2k->m_current_tile_number,(int)p_buffer + 9,(OPJ_BYTE *)&local_4c,
                     (OPJ_UINT32 *)local_48,in_R9);
  uVar2 = local_40;
  if ((OVar4 != 0) && (local_4c == 0)) {
    OVar5 = opj_stream_write_data
                      (local_38,(p_j2k->m_specific_param).m_encoder.m_header_tile_data,local_40,
                       p_manager);
    return (uint)(OVar5 == uVar2);
  }
  fmt = "Error writing COD marker\n";
LAB_0011fbe4:
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_write_cod(opj_j2k_t *p_j2k,
                                  opj_stream_private_t *p_stream,
                                  opj_event_mgr_t * p_manager)
{
    opj_cp_t *l_cp = 00;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_code_size, l_remaining_size;
    OPJ_BYTE * l_current_data = 00;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_manager != 00);
    assert(p_stream != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = &l_cp->tcps[p_j2k->m_current_tile_number];
    l_code_size = 9 + opj_j2k_get_SPCod_SPCoc_size(p_j2k,
                  p_j2k->m_current_tile_number, 0);
    l_remaining_size = l_code_size;

    if (l_code_size > p_j2k->m_specific_param.m_encoder.m_header_tile_data_size) {
        OPJ_BYTE *new_header_tile_data = (OPJ_BYTE *) opj_realloc(
                                             p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_code_size);
        if (! new_header_tile_data) {
            opj_free(p_j2k->m_specific_param.m_encoder.m_header_tile_data);
            p_j2k->m_specific_param.m_encoder.m_header_tile_data = NULL;
            p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = 0;
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to write COD marker\n");
            return OPJ_FALSE;
        }
        p_j2k->m_specific_param.m_encoder.m_header_tile_data = new_header_tile_data;
        p_j2k->m_specific_param.m_encoder.m_header_tile_data_size = l_code_size;
    }

    l_current_data = p_j2k->m_specific_param.m_encoder.m_header_tile_data;

    opj_write_bytes(l_current_data, J2K_MS_COD, 2);           /* COD */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_code_size - 2, 2);      /* L_COD */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_tcp->csty, 1);          /* Scod */
    ++l_current_data;

    opj_write_bytes(l_current_data, (OPJ_UINT32)l_tcp->prg, 1); /* SGcod (A) */
    ++l_current_data;

    opj_write_bytes(l_current_data, l_tcp->numlayers, 2);     /* SGcod (B) */
    l_current_data += 2;

    opj_write_bytes(l_current_data, l_tcp->mct, 1);           /* SGcod (C) */
    ++l_current_data;

    l_remaining_size -= 9;

    if (! opj_j2k_write_SPCod_SPCoc(p_j2k, p_j2k->m_current_tile_number, 0,
                                    l_current_data, &l_remaining_size, p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing COD marker\n");
        return OPJ_FALSE;
    }

    if (l_remaining_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error writing COD marker\n");
        return OPJ_FALSE;
    }

    if (opj_stream_write_data(p_stream,
                              p_j2k->m_specific_param.m_encoder.m_header_tile_data, l_code_size,
                              p_manager) != l_code_size) {
        return OPJ_FALSE;
    }

    return OPJ_TRUE;
}